

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_C14NDocDumpMemory(PyObject *self,PyObject *args)

{
  long lVar1;
  int iVar2;
  PyObject *pPVar3;
  char *pcVar4;
  undefined8 uVar5;
  xmlChar **idx;
  xmlChar **ppxVar6;
  xmlChar **ppxVar7;
  int exclusive;
  int with_comments;
  xmlChar *doc_txt;
  xmlChar **prefixes;
  xmlNodeSetPtr nodes;
  PyObject *pyobj_prefixes;
  PyObject *pyobj_nodes;
  PyObject *pyobj_doc;
  uint local_58;
  undefined4 local_54;
  undefined8 local_50;
  xmlChar **local_48;
  xmlNodeSetPtr local_40;
  PyObject *local_38;
  PyObject *local_30;
  undefined *local_28;
  
  local_48 = (xmlChar **)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT
                    (args,"OOiOi:C14NDocDumpMemory",&local_28,&local_30,&local_58,&local_38,
                     &local_54);
  if (iVar2 == 0) {
    return (PyObject *)0x0;
  }
  if ((local_28 == &_Py_NoneStruct) || (lVar1 = *(long *)(local_28 + 0x10), lVar1 == 0)) {
    pcVar4 = "bad document.";
    uVar5 = _PyExc_TypeError;
  }
  else {
    iVar2 = PyxmlNodeSet_Convert(local_30,&local_40);
    if (iVar2 < 0) {
      return (PyObject *)0x0;
    }
    if (local_58 == 0) {
      ppxVar7 = (xmlChar **)0x0;
      local_58 = 0;
    }
    else {
      iVar2 = PystringSet_Convert(local_38,&local_48);
      ppxVar7 = local_48;
      if (iVar2 < 0) {
        if (local_40 == (xmlNodeSetPtr)0x0) {
          return (PyObject *)0x0;
        }
        (*_xmlFree)(local_40->nodeTab);
        (*_xmlFree)(local_40);
        return (PyObject *)0x0;
      }
    }
    iVar2 = xmlC14NDocDumpMemory(lVar1,local_40,local_58,ppxVar7,local_54,&local_50);
    if (local_40 != (xmlNodeSetPtr)0x0) {
      (*_xmlFree)(local_40->nodeTab);
      (*_xmlFree)(local_40);
    }
    ppxVar6 = ppxVar7;
    if (ppxVar7 != (xmlChar **)0x0) {
      for (; *ppxVar6 != (xmlChar *)0x0; ppxVar6 = ppxVar6 + 1) {
        (*_xmlFree)();
      }
      (*_xmlFree)(ppxVar7);
    }
    if (-1 < iVar2) {
      pPVar3 = (PyObject *)PyUnicode_FromStringAndSize(local_50,iVar2);
      (*_xmlFree)(local_50);
      return pPVar3;
    }
    pcVar4 = "libxml2 xmlC14NDocDumpMemory failure.";
    uVar5 = _PyExc_Exception;
  }
  PyErr_SetString(uVar5,pcVar4);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *
libxml_C14NDocDumpMemory(ATTRIBUTE_UNUSED PyObject * self,
                         PyObject * args)
{
    PyObject *py_retval = NULL;

    PyObject *pyobj_doc;
    PyObject *pyobj_nodes;
    int exclusive;
    PyObject *pyobj_prefixes;
    int with_comments;

    xmlDocPtr doc;
    xmlNodeSetPtr nodes;
    xmlChar **prefixes = NULL;
    xmlChar *doc_txt;

    int result;

    if (!PyArg_ParseTuple(args, (char *) "OOiOi:C14NDocDumpMemory",
                          &pyobj_doc,
                          &pyobj_nodes,
                          &exclusive,
                          &pyobj_prefixes,
                          &with_comments))
        return (NULL);

    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    if (!doc) {
        PyErr_SetString(PyExc_TypeError, "bad document.");
        return NULL;
    }

    result = PyxmlNodeSet_Convert(pyobj_nodes, &nodes);
    if (result < 0) return NULL;

    if (exclusive) {
        result = PystringSet_Convert(pyobj_prefixes, &prefixes);
        if (result < 0) {
            if (nodes) {
                xmlFree(nodes->nodeTab);
                xmlFree(nodes);
            }
            return NULL;
        }
    }

    result = xmlC14NDocDumpMemory(doc,
                                  nodes,
                                  exclusive,
                                  prefixes,
                                  with_comments,
                                  &doc_txt);

    if (nodes) {
        xmlFree(nodes->nodeTab);
        xmlFree(nodes);
    }
    if (prefixes) {
        xmlChar ** idx = prefixes;
        while (*idx) xmlFree(*(idx++));
        xmlFree(prefixes);
    }

    if (result < 0) {
        PyErr_SetString(PyExc_Exception,
                        "libxml2 xmlC14NDocDumpMemory failure.");
        return NULL;
    }
    else {
        py_retval = PY_IMPORT_STRING_SIZE((const char *) doc_txt,
                                                result);
        xmlFree(doc_txt);
        return py_retval;
    }
}